

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void copy_suite::copy_null(void)

{
  undefined1 *this;
  undefined4 local_80;
  type local_7c;
  undefined1 local_77;
  undefined1 local_76 [14];
  undefined1 local_68 [8];
  variable copy;
  variable data;
  
  this = &copy.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68,
             (basic_variable<std::allocator<char>_> *)this);
  local_76[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_68);
  local_77 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x602,"void copy_suite::copy_null()",local_76,&local_77);
  local_7c = trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::nullable>
                       ((basic_variable<std::allocator<char>_> *)local_68);
  local_80 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::nullable,trial::dynamic::nullable>
            ("copy.value<nullable>()","null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x603,"void copy_suite::copy_null()",&local_7c,&local_80);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy.storage.field_0x28);
  return;
}

Assistant:

void copy_null()
{
    variable data;
    variable copy(data);
    TRIAL_PROTOCOL_TEST_EQUAL(copy.is<nullable>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(copy.value<nullable>(), null);
}